

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::parsePragmaValue(Preprocessor *this)

{
  TokenKind kind;
  Token matchingDelim;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ParenPragmaExpressionSyntax *pPVar5;
  SourceLocation SVar6;
  undefined4 extraout_var;
  Info *extraout_RDX;
  ulong unaff_RBP;
  ulong uVar7;
  Token *args;
  BumpAllocator *pBVar8;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar9;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var10;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var11;
  Token actual;
  Token openParen;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> values;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_128;
  undefined1 local_118;
  Token local_110;
  Info *local_100;
  Diagnostics *local_f8;
  BumpAllocator *local_f0;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_d8;
  undefined1 local_c8 [32];
  Token local_a8;
  bool local_98;
  Token local_50;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_40;
  Info *src;
  
  pVar9 = checkNextPragmaToken(this);
  pPVar5 = (ParenPragmaExpressionSyntax *)pVar9.first;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar7 = (ulong)pVar9._8_4_;
    goto LAB_0030cce8;
  }
  local_110 = peek(this);
  kind = local_110.kind;
  if ((ushort)(kind - IntegerLiteral) < 2) {
    NumberParser::parseInteger<slang::parsing::Preprocessor,true>
              ((IntResult *)local_c8,&this->numberParser,this);
    pBVar8 = this->alloc;
    if (local_98 == true) {
      args = &local_a8;
LAB_0030cc90:
      pPVar5 = (ParenPragmaExpressionSyntax *)
               BumpAllocator::
               emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                         (pBVar8,args);
    }
    else {
      pPVar5 = (ParenPragmaExpressionSyntax *)
               BumpAllocator::
               emplace<slang::syntax::NumberPragmaExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                         (pBVar8,(Token *)local_c8,(Token *)(local_c8 + 0x10),&local_a8);
    }
  }
  else {
    if ((kind != Identifier) && (kind != StringLiteral)) {
      if (kind == RealLiteral) {
        local_c8._0_16_ =
             (undefined1  [16])
             NumberParser::parseReal<slang::parsing::Preprocessor>(&this->numberParser,this);
        args = (Token *)local_c8;
        pBVar8 = this->alloc;
        goto LAB_0030cc90;
      }
      bVar2 = LexerFacts::isKeyword(kind);
      if (!bVar2) {
        if (local_110.kind == OpenParenthesis) {
          local_c8._8_8_ = 0;
          local_c8._0_8_ = local_c8 + 0x18;
          local_c8._16_8_ = 4;
          _Var10._M_first._M_storage = (_Uninitialized<slang::parsing::Token,_true>)consume(this);
          bVar2 = false;
          local_d8._M_first._M_storage = _Var10._M_first._M_storage;
          while (bVar3 = peekSameLine(this), bVar3) {
            local_110 = peek(this);
            if (bVar2) {
              if (local_110.kind == CloseParenthesis) {
                uVar7 = CONCAT71((int7)(unaff_RBP >> 8),1);
                goto LAB_0030ce5a;
              }
              _Var10._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)expect(this,Comma);
              local_118 = 0;
              local_128._M_first._M_storage = _Var10._M_first._M_storage;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_c8,
                         (TokenOrSyntax *)&local_128._M_first);
            }
            else {
              pVar9 = parsePragmaExpression(this);
              unaff_RBP = (ulong)pVar9._8_4_;
              local_128._M_rest =
                   (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
                   &(pVar9.first)->super_SyntaxNode;
              local_118 = 1;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_c8,
                         (TokenOrSyntax *)&local_128._M_first);
              if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                _Var10._M_first._M_storage =
                     (_Uninitialized<slang::parsing::Token,_true>)
                     slang::syntax::SyntaxNode::getLastToken(&(pVar9.first)->super_SyntaxNode);
              }
              if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
          uVar7 = 0;
LAB_0030ce5a:
          Token::Token(&local_128._M_first._M_storage);
          bVar2 = peekSameLine(this);
          _Var11._M_first._M_storage.info = extraout_RDX;
          _Var11._M_rest = _Var10._M_rest;
          _Var1 = _Var10;
          if (bVar2) {
            local_100 = _Var10._8_8_;
            _Var11._M_first._M_storage = (_Uninitialized<slang::parsing::Token,_true>)peek(this);
            local_100 = _Var11._8_8_;
            _Var1._M_first._M_storage = _Var11._M_first._M_storage;
            if (_Var11._0_2_ == CloseParenthesis) {
              local_128._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)consume(this);
              _Var1._M_first._M_storage.info = local_100;
              _Var1._M_rest = _Var11._M_rest;
              _Var11._M_first._M_storage.info = local_128._8_8_;
              _Var11._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x12;
            }
          }
          local_100 = _Var1._8_8_;
          src = _Var11._8_8_;
          if (local_128._M_first._M_storage.info == (Info *)0x0) {
            local_f0 = this->alloc;
            local_f8 = this->diagnostics;
            local_e8 = _Var10;
            Token::Token(&local_50);
            actual._0_8_ = (ulong)_Var11._M_rest & 0xffff |
                           (ulong)_Var1._M_rest & 0xffffffffffff0000;
            matchingDelim.info = local_50.info;
            matchingDelim.kind = local_50.kind;
            matchingDelim._2_1_ = local_50._2_1_;
            matchingDelim.numFlags.raw = local_50.numFlags.raw;
            matchingDelim.rawLen = local_50.rawLen;
            actual.info = local_100;
            local_128._M_first._M_storage =
                 (_Uninitialized<slang::parsing::Token,_true>)
                 Token::createExpected
                           (local_f0,local_f8,actual,CloseParenthesis,
                            (Token)local_e8._M_first._M_storage,matchingDelim);
            src = local_128._8_8_;
          }
          pBVar8 = this->alloc;
          iVar4 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_c8,
                             (EVP_PKEY_CTX *)pBVar8,(EVP_PKEY_CTX *)src);
          local_40._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
          pPVar5 = BumpAllocator::
                   emplace<slang::syntax::ParenPragmaExpressionSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                             (pBVar8,&local_d8._M_first._M_storage,&local_40,
                              &local_128._M_first._M_storage);
          if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x18)) {
            operator_delete((void *)local_c8._0_8_);
          }
        }
        else {
          SVar6 = Token::location(&local_110);
          addDiag(this,(DiagCode)0x80004,SVar6);
          pBVar8 = this->alloc;
          SVar6 = Token::location(&local_110);
          local_c8._0_16_ = (undefined1  [16])Token::createMissing(pBVar8,Identifier,SVar6);
          pPVar5 = (ParenPragmaExpressionSyntax *)
                   BumpAllocator::
                   emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                             (this->alloc,(Token *)local_c8);
          uVar7 = 0;
        }
        goto LAB_0030cce8;
      }
    }
    pBVar8 = this->alloc;
    local_c8._0_16_ = (undefined1  [16])consume(this);
    pPVar5 = (ParenPragmaExpressionSyntax *)
             BumpAllocator::
             emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token>
                       (pBVar8,(Token *)local_c8);
  }
  uVar7 = CONCAT71((int7)(unaff_RBP >> 8),1);
LAB_0030cce8:
  pVar9._8_8_ = uVar7 & 0xffffffff;
  pVar9.first = &pPVar5->super_PragmaExpressionSyntax;
  return pVar9;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::parsePragmaValue() {
    if (auto pair = checkNextPragmaToken(); !pair.second)
        return pair;

    Token token = peek();
    if (token.kind == TokenKind::IntegerBase || token.kind == TokenKind::IntegerLiteral) {
        PragmaExpressionSyntax* expr;
        auto result = numberParser.parseInteger<Preprocessor, true>(*this);
        if (result.isSimple) {
            expr = alloc.emplace<SimplePragmaExpressionSyntax>(result.value);
        }
        else {
            expr = alloc.emplace<NumberPragmaExpressionSyntax>(result.size, result.base,
                                                               result.value);
        }

        return {expr, true};
    }

    if (token.kind == TokenKind::RealLiteral) {
        auto result = numberParser.parseReal(*this);
        return {alloc.emplace<SimplePragmaExpressionSyntax>(result), true};
    }

    if (token.kind == TokenKind::Identifier || token.kind == TokenKind::StringLiteral ||
        LexerFacts::isKeyword(token.kind)) {
        return {alloc.emplace<SimplePragmaExpressionSyntax>(consume()), true};
    }

    if (token.kind != TokenKind::OpenParenthesis) {
        addDiag(diag::ExpectedPragmaExpression, token.location());

        auto expected = Token::createMissing(alloc, TokenKind::Identifier, token.location());
        return {alloc.emplace<SimplePragmaExpressionSyntax>(expected), false};
    }

    SmallVector<TokenOrSyntax, 4> values;
    Token openParen = consume();
    bool wantComma = false;
    bool ok = false;

    // This keeps track of the last real token we've consumed before
    // breaking from the loop; if there's an error it's possible we've
    // gone on and parsed more directives into the resulting token,
    // so this is necessary to correctly place the diagnostic.
    Token lastToken = openParen;

    while (peekSameLine()) {
        token = peek();
        if (wantComma) {
            if (token.kind == TokenKind::CloseParenthesis) {
                ok = true;
                break;
            }

            Token comma = expect(TokenKind::Comma);
            values.push_back(comma);
            wantComma = false;
            lastToken = comma;
        }
        else {
            auto [expr, succeeded] = parsePragmaExpression();
            values.push_back(expr);
            wantComma = true;

            if (!succeeded)
                break;

            lastToken = expr->getLastToken();
        }
    }

    Token nextUp = lastToken;
    Token closeParen;
    if (peekSameLine()) {
        nextUp = peek();
        if (nextUp.kind == TokenKind::CloseParenthesis)
            closeParen = consume();
    }

    if (!closeParen) {
        closeParen = Token::createExpected(alloc, diagnostics, nextUp, TokenKind::CloseParenthesis,
                                           lastToken, Token());
    }

    return {alloc.emplace<ParenPragmaExpressionSyntax>(openParen, values.copy(alloc), closeParen),
            ok};
}